

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  int in_ESI;
  long in_RDI;
  ImVec2 min;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  ImVec2 local_24 [2];
  ImRect local_10;
  
  if (in_ESI == 0) {
    local_10 = ImGuiWindow::Rect((ImGuiWindow *)0x1ecf8e);
  }
  else if (in_ESI == 1) {
    local_10 = *(ImRect *)(in_RDI + 0x218);
  }
  else if (in_ESI == 2) {
    local_10 = *(ImRect *)(in_RDI + 0x228);
  }
  else if (in_ESI == 3) {
    local_10 = *(ImRect *)(in_RDI + 0x238);
  }
  else if (in_ESI == 4) {
    local_10 = *(ImRect *)(in_RDI + 0x248);
  }
  else if (in_ESI == 5) {
    ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                (ImVec2 *)0x1ed062);
    local_24[0] = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (ImVec2 *)0x1ed07b);
    operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
              (ImVec2 *)0x1ed094);
    ImRect::ImRect(&local_10,local_24,(ImVec2 *)&stack0xffffffffffffffcc);
  }
  else {
    if (in_ESI != 6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x27d9,
                    "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                   );
    }
    local_10 = *(ImRect *)(in_RDI + 0x268);
  }
  return local_10;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }